

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

optional<wallet::SelectionResult> *
wallet::coinselector_tests::KnapsackSolver
          (optional<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
          CAmount *nTargetValue,CAmount change_target,FastRandomContext *rng)

{
  CAmount CVar1;
  undefined8 uVar2;
  _Storage<long,_true> _Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_t sVar6;
  CAmount CVar7;
  T *__x;
  long in_FS_OFFSET;
  Result<wallet::SelectionResult> res;
  _Variant_storage<false,_bilingual_str,_wallet::SelectionResult> local_90;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  wallet::KnapsackSolver
            ((Result<wallet::SelectionResult> *)&local_90,groups,nTargetValue,change_target,rng,
             400000);
  if (local_90._M_index == '\x01') {
    __x = util::Result<wallet::SelectionResult>::value((Result<wallet::SelectionResult> *)&local_90)
    ;
    std::
    _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ::_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                *)__return_storage_ptr__,
               (_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                *)__x);
    CVar1 = __x->m_target;
    uVar2 = *(undefined8 *)&__x->m_algo;
    _Var3 = (__x->m_waste).super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload;
    uVar4 = *(undefined8 *)
             &(__x->m_waste).super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged;
    uVar5 = *(undefined8 *)&__x->m_algo_completed;
    sVar6 = __x->m_selections_evaluated;
    CVar7 = __x->bump_fee_group_discount;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<wallet::SelectionResult,_false,_false>).
             _M_payload.super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload + 0x60) =
         *(undefined8 *)&__x->m_weight;
    (__return_storage_ptr__->super__Optional_base<wallet::SelectionResult,_false,_false>)._M_payload
    .super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
    bump_fee_group_discount = CVar7;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<wallet::SelectionResult,_false,_false>).
             _M_payload.super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload + 0x50) = uVar5;
    (__return_storage_ptr__->super__Optional_base<wallet::SelectionResult,_false,_false>)._M_payload
    .super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selections_evaluated
         = sVar6;
    *(_Storage<long,_true> *)
     &(__return_storage_ptr__->super__Optional_base<wallet::SelectionResult,_false,_false>).
      _M_payload.super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_waste.
      super__Optional_base<long,_true,_true> = _Var3;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<wallet::SelectionResult,_false,_false>).
             _M_payload.super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_waste.
             super__Optional_base<long,_true,_true> + 8) = uVar4;
    (__return_storage_ptr__->super__Optional_base<wallet::SelectionResult,_false,_false>)._M_payload
    .super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_target = CVar1;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<wallet::SelectionResult,_false,_false>).
             _M_payload.super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload + 0x38) = uVar2;
  }
  (__return_storage_ptr__->super__Optional_base<wallet::SelectionResult,_false,_false>)._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_engaged = local_90._M_index == '\x01';
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<SelectionResult> KnapsackSolver(std::vector<OutputGroup>& groups, const CAmount& nTargetValue,
                                              CAmount change_target, FastRandomContext& rng)
{
    auto res{KnapsackSolver(groups, nTargetValue, change_target, rng, MAX_STANDARD_TX_WEIGHT)};
    return res ? std::optional<SelectionResult>(*res) : std::nullopt;
}